

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionNextChar.cpp
# Opt level: O0

void __thiscall
Hpipe::InstructionNextChar::write_cpp
          (InstructionNextChar *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter)

{
  CppEmitter *this_00;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  StreamSep *pSVar4;
  Transition *pTVar5;
  StreamSep local_b68;
  int local_b1c;
  char *local_b18;
  StreamSep local_b10;
  StreamSep local_ac8;
  int local_a7c;
  char *local_a78;
  StreamSep local_a70;
  int local_a24;
  StreamSep local_a20;
  int local_9d4;
  StreamSep local_9d0;
  StreamSep local_988;
  StreamSepMaker local_940;
  StreamSep local_8b8;
  StreamSep local_870;
  StreamSep local_828;
  int local_7dc;
  StreamSep local_7d8;
  StreamSep local_790;
  StreamSep local_748;
  StreamSep local_700;
  byte local_6b4;
  allocator local_6b3;
  byte local_6b2;
  byte local_6b1;
  string local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  StreamSepMaker local_650;
  StreamSep local_5c8;
  StreamSep local_580;
  uint local_534;
  StreamSep local_530;
  StreamSep local_4e8;
  StreamSep local_4a0;
  StreamSep local_458;
  string local_410;
  allocator local_3e9;
  string local_3e8;
  allocator local_3c1;
  string local_3c0;
  int local_39c;
  StreamSep local_398;
  int local_34c;
  StreamSep local_348;
  int local_300;
  uint local_2fc;
  StreamSep local_2f8;
  int local_2ac;
  StreamSep local_2a8;
  int local_25c;
  StreamSep local_258;
  byte local_20c;
  allocator local_20b;
  byte local_20a;
  byte local_209;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  StreamSepMaker local_1a8;
  StreamSep local_120;
  StreamSep local_d8;
  char *local_80;
  StreamSep local_78;
  uint local_2c;
  CppEmitter *pCStack_28;
  uint cont_label;
  CppEmitter *cpp_emitter_local;
  StreamSepMaker *es_local;
  StreamSepMaker *ss_local;
  InstructionNextChar *this_local;
  
  pCStack_28 = cpp_emitter;
  cpp_emitter_local = (CppEmitter *)es;
  es_local = ss;
  ss_local = (StreamSepMaker *)this;
  bVar1 = CppEmitter::need_buf(cpp_emitter);
  if (bVar1) {
    local_2c = pCStack_28->nb_cont_label + 1;
    pCStack_28->nb_cont_label = local_2c;
    StreamSepMaker::operator<<(&local_78,es_local,(char (*) [11])"if ( data ");
    local_80 = ">=";
    if (((this->super_Instruction).field_0x174 & 1) != 0) {
      local_80 = ">";
    }
    pSVar4 = StreamSep::operator<<(&local_78,&local_80);
    pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [18])0x24b6c6);
    pSVar4 = StreamSep::operator<<(pSVar4,&local_2c);
    StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
    StreamSep::~StreamSep(&local_78);
    if (((this->super_Instruction).field_0x174 & 1) == 0) {
      StreamSepMaker::operator<<(&local_d8,es_local,(char (*) [8])"++data;");
      StreamSep::~StreamSep(&local_d8);
    }
    StreamSepMaker::rm_beg(&local_1a8,(StreamSepMaker *)cpp_emitter_local,2);
    StreamSepMaker::operator<<(&local_120,&local_1a8,(char (*) [3])0x24a333);
    pSVar4 = StreamSep::operator<<(&local_120,&local_2c);
    pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [2])0x2497fc);
    local_209 = 0;
    local_20a = 0;
    local_20c = 0;
    if ((pCStack_28->trace_labels & 1U) == 0) {
      std::allocator<char>::allocator();
      local_20c = 1;
      std::__cxx11::string::string((string *)&local_1c8,"",&local_20b);
    }
    else {
      to_string<unsigned_int>(&local_208,&local_2c);
      local_209 = 1;
      std::operator+(&local_1e8," std::cout << \"c_",&local_208);
      local_20a = 1;
      std::operator+(&local_1c8,&local_1e8," \" << __LINE__ << std::endl;");
    }
    StreamSep::operator<<(pSVar4,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    if ((local_20c & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_20b);
    }
    if ((local_20a & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    if ((local_209 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_208);
    }
    StreamSep::~StreamSep(&local_120);
    StreamSepMaker::~StreamSepMaker(&local_1a8);
    if ((((this->super_Instruction).field_0x174 & 1) != 0) &&
       (sVar3 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                          (&(this->super_Instruction).next.
                            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>),
       1 < sVar3)) {
      StreamSepMaker::operator<<
                (&local_258,(StreamSepMaker *)cpp_emitter_local,
                 (char (*) [21])"if ( ! buf ) goto l_");
      pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
      local_25c = Instruction::get_id_gen(pTVar5->inst,pCStack_28);
      pSVar4 = StreamSep::operator<<(&local_258,&local_25c);
      StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
      StreamSep::~StreamSep(&local_258);
    }
    if (pCStack_28->buffer_type == 0) {
      StreamSepMaker::operator<<
                (&local_2a8,(StreamSepMaker *)cpp_emitter_local,
                 (char (*) [173])
                 "while ( buf->next ) { end -= buf->used; buf = buf->next; if ( buf && buf->used ) { data = buf->data; end_m1 = buf->data + ( buf->used < end ? buf->used : end ) - 1; goto l_"
                );
      pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,0);
      local_2ac = Instruction::get_id_gen(pTVar5->inst,pCStack_28);
      pSVar4 = StreamSep::operator<<(&local_2a8,&local_2ac);
      StreamSep::operator<<(pSVar4,(char (*) [6])"; } }");
      StreamSep::~StreamSep(&local_2a8);
    }
    else {
      uVar2 = Instruction::need_buf_next(&this->super_Instruction);
      if (uVar2 == 0) {
        StreamSepMaker::operator<<
                  (&local_348,(StreamSepMaker *)cpp_emitter_local,
                   (char (*) [175])
                   "while ( buf->next ) { HPIPE_BUFF_T *old = buf; buf = buf->next; HPIPE_BUFF_T__DEC_REF( old ); if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_"
                  );
        pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,0);
        local_34c = Instruction::get_id_gen(pTVar5->inst,pCStack_28);
        pSVar4 = StreamSep::operator<<(&local_348,&local_34c);
        StreamSep::operator<<(pSVar4,(char (*) [6])"; } }");
        StreamSep::~StreamSep(&local_348);
      }
      else {
        StreamSepMaker::operator<<
                  (&local_2f8,(StreamSepMaker *)cpp_emitter_local,
                   (char (*) [53])"while ( buf->next ) { HPIPE_BUFF_T__INC_REF_N( buf, ");
        local_2fc = Instruction::need_buf_next(&this->super_Instruction);
        local_2fc = local_2fc - 1;
        pSVar4 = StreamSep::operator<<(&local_2f8,&local_2fc);
        pSVar4 = StreamSep::operator<<
                           (pSVar4,(char (*) [102])
                                   " ); buf = buf->next; if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_"
                           );
        pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,0);
        local_300 = Instruction::get_id_gen(pTVar5->inst,pCStack_28);
        pSVar4 = StreamSep::operator<<(pSVar4,&local_300);
        StreamSep::operator<<(pSVar4,(char (*) [6])"; } }");
        StreamSep::~StreamSep(&local_2f8);
      }
    }
    bVar1 = CppEmitter::interruptible(pCStack_28);
    if (bVar1) {
      sVar3 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                        (&(this->super_Instruction).next.
                          super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
      if (1 < sVar3) {
        StreamSepMaker::operator<<
                  (&local_398,(StreamSepMaker *)cpp_emitter_local,
                   (char (*) [24])"if ( last_buf ) goto l_");
        pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
        local_39c = Instruction::get_id_gen(pTVar5->inst,pCStack_28);
        pSVar4 = StreamSep::operator<<(&local_398,&local_39c);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
        StreamSep::~StreamSep(&local_398);
      }
      uVar2 = Instruction::need_buf_next(&this->super_Instruction);
      this_00 = pCStack_28;
      if (uVar2 == 0) {
        StreamSepMaker::operator<<
                  (&local_828,(StreamSepMaker *)cpp_emitter_local,(char (*) [27])0x24a1c3);
        pSVar4 = StreamSep::operator<<(&local_828,&local_2c);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
        StreamSep::~StreamSep(&local_828);
        StreamSepMaker::operator<<
                  (&local_870,(StreamSepMaker *)cpp_emitter_local,(char (*) [17])0x24a209);
        StreamSep::~StreamSep(&local_870);
        StreamSepMaker::rm_beg(&local_940,(StreamSepMaker *)cpp_emitter_local,2);
        StreamSepMaker::operator<<(&local_8b8,&local_940,(char (*) [3])0x24a220);
        pSVar4 = StreamSep::operator<<(&local_8b8,&local_2c);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x2497fc);
        StreamSep::~StreamSep(&local_8b8);
        StreamSepMaker::~StreamSepMaker(&local_940);
        StreamSepMaker::operator<<
                  (&local_988,(StreamSepMaker *)cpp_emitter_local,
                   (char (*) [29])"if ( data > end_m1 ) goto c_");
        pSVar4 = StreamSep::operator<<(&local_988,&local_2c);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
        StreamSep::~StreamSep(&local_988);
        StreamSepMaker::operator<<
                  (&local_9d0,(StreamSepMaker *)cpp_emitter_local,(char (*) [8])0x24a134);
        pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,0);
        local_9d4 = Instruction::get_id_gen(pTVar5->inst,pCStack_28);
        pSVar4 = StreamSep::operator<<(&local_9d0,&local_9d4);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
        StreamSep::~StreamSep(&local_9d0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3c0,"pending_buf",&local_3c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3e8,"HPIPE_BUFF_T *",&local_3e9);
        std::__cxx11::string::string((string *)&local_410);
        CppEmitter::add_variable(this_00,&local_3c0,&local_3e8,&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
        StreamSepMaker::operator<<
                  (&local_458,(StreamSepMaker *)cpp_emitter_local,(char (*) [30])0x24a150);
        StreamSep::~StreamSep(&local_458);
        StreamSepMaker::operator<<
                  (&local_4a0,(StreamSepMaker *)cpp_emitter_local,(char (*) [27])0x24a1c3);
        pSVar4 = StreamSep::operator<<(&local_4a0,&local_2c);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
        StreamSep::~StreamSep(&local_4a0);
        uVar2 = Instruction::need_buf_next(&this->super_Instruction);
        if (uVar2 == 1) {
          StreamSepMaker::operator<<
                    (&local_4e8,(StreamSepMaker *)cpp_emitter_local,(char (*) [30])0x24a176);
          StreamSep::~StreamSep(&local_4e8);
        }
        else {
          StreamSepMaker::operator<<
                    (&local_530,(StreamSepMaker *)cpp_emitter_local,(char (*) [31])0x24a19c);
          local_534 = Instruction::need_buf_next(&this->super_Instruction);
          pSVar4 = StreamSep::operator<<(&local_530,&local_534);
          StreamSep::operator<<(pSVar4,(char (*) [4])0x2496e6);
          StreamSep::~StreamSep(&local_530);
        }
        StreamSepMaker::operator<<
                  (&local_580,(StreamSepMaker *)cpp_emitter_local,(char (*) [17])0x24a209);
        StreamSep::~StreamSep(&local_580);
        StreamSepMaker::rm_beg(&local_650,(StreamSepMaker *)cpp_emitter_local,2);
        StreamSepMaker::operator<<(&local_5c8,&local_650,(char (*) [3])0x24a220);
        pSVar4 = StreamSep::operator<<(&local_5c8,&local_2c);
        pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [2])0x2497fc);
        local_6b1 = 0;
        local_6b2 = 0;
        local_6b4 = 0;
        if ((pCStack_28->trace_labels & 1U) == 0) {
          std::allocator<char>::allocator();
          local_6b4 = 1;
          std::__cxx11::string::string((string *)&local_670,"",&local_6b3);
        }
        else {
          to_string<unsigned_int>(&local_6b0,&local_2c);
          local_6b1 = 1;
          std::operator+(&local_690," std::cout << \"e_",&local_6b0);
          local_6b2 = 1;
          std::operator+(&local_670,&local_690," \" << __LINE__ << std::endl;");
        }
        StreamSep::operator<<(pSVar4,&local_670);
        std::__cxx11::string::~string((string *)&local_670);
        if ((local_6b4 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_6b3);
        }
        if ((local_6b2 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_690);
        }
        if ((local_6b1 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_6b0);
        }
        StreamSep::~StreamSep(&local_5c8);
        StreamSepMaker::~StreamSepMaker(&local_650);
        StreamSepMaker::operator<<
                  (&local_700,(StreamSepMaker *)cpp_emitter_local,(char (*) [36])0x24a25a);
        StreamSep::~StreamSep(&local_700);
        StreamSepMaker::operator<<
                  (&local_748,(StreamSepMaker *)cpp_emitter_local,(char (*) [30])0x24a150);
        StreamSep::~StreamSep(&local_748);
        StreamSepMaker::operator<<
                  (&local_790,(StreamSepMaker *)cpp_emitter_local,
                   (char (*) [29])"if ( data > end_m1 ) goto c_");
        pSVar4 = StreamSep::operator<<(&local_790,&local_2c);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
        StreamSep::~StreamSep(&local_790);
        StreamSepMaker::operator<<
                  (&local_7d8,(StreamSepMaker *)cpp_emitter_local,(char (*) [8])0x24a134);
        pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,0);
        local_7dc = Instruction::get_id_gen(pTVar5->inst,pCStack_28);
        pSVar4 = StreamSep::operator<<(&local_7d8,&local_7dc);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
        StreamSep::~StreamSep(&local_7d8);
      }
    }
    else {
      sVar3 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                        (&(this->super_Instruction).next.
                          super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
      if (1 < sVar3) {
        StreamSepMaker::operator<<
                  (&local_a20,(StreamSepMaker *)cpp_emitter_local,(char (*) [8])0x24a134);
        pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
        local_a24 = Instruction::get_id_gen(pTVar5->inst,pCStack_28);
        pSVar4 = StreamSep::operator<<(&local_a20,&local_a24);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
        StreamSep::~StreamSep(&local_a20);
      }
    }
  }
  else if (pCStack_28->buffer_type == 3) {
    sVar3 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                      (&(this->super_Instruction).next.
                        super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
    if (1 < sVar3) {
      StreamSepMaker::operator<<(&local_a70,es_local,(char (*) [7])"if ( *");
      local_a78 = "( data + 1 )";
      if (((this->super_Instruction).field_0x174 & 1) != 0) {
        local_a78 = "data";
      }
      pSVar4 = StreamSep::operator<<(&local_a70,&local_a78);
      pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [5])0x24ac34);
      pSVar4 = StreamSep::operator<<(pSVar4,&pCStack_28->stop_char);
      pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [11])0x24ac03);
      pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
      local_a7c = Instruction::get_id_gen(pTVar5->inst,pCStack_28);
      pSVar4 = StreamSep::operator<<(pSVar4,&local_a7c);
      StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
      StreamSep::~StreamSep(&local_a70);
    }
    if (((this->super_Instruction).field_0x174 & 1) == 0) {
      StreamSepMaker::operator<<(&local_ac8,es_local,(char (*) [8])"++data;");
      StreamSep::~StreamSep(&local_ac8);
    }
  }
  else {
    sVar3 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                      (&(this->super_Instruction).next.
                        super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
    if (1 < sVar3) {
      StreamSepMaker::operator<<(&local_b10,es_local,(char (*) [11])"if ( data ");
      local_b18 = ">=";
      if (((this->super_Instruction).field_0x174 & 1) != 0) {
        local_b18 = ">";
      }
      pSVar4 = StreamSep::operator<<(&local_b10,&local_b18);
      pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [18])0x24a499);
      pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
      local_b1c = Instruction::get_id_gen(pTVar5->inst,pCStack_28);
      pSVar4 = StreamSep::operator<<(pSVar4,&local_b1c);
      StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
      StreamSep::~StreamSep(&local_b10);
    }
    if (((this->super_Instruction).field_0x174 & 1) == 0) {
      StreamSepMaker::operator<<(&local_b68,es_local,(char (*) [8])"++data;");
      StreamSep::~StreamSep(&local_b68);
    }
  }
  Instruction::write_trans(&this->super_Instruction,es_local,pCStack_28,0);
  return;
}

Assistant:

void InstructionNextChar::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    if ( cpp_emitter->need_buf() ) {
        unsigned cont_label = ++cpp_emitter->nb_cont_label;
        ss << "if ( data " << ( beg ? ">" : ">=" ) << " end_m1 ) goto c_" << cont_label << ";"; // this one is good but it won't the case for the next
        if ( ! beg )
            ss << "++data;";

        // c_... (code when there is no data left in the buffer)
        es.rm_beg( 2 ) << "c_" << cont_label << ":" << ( cpp_emitter->trace_labels ? " std::cout << \"c_" + to_string( cont_label ) + " \" << __LINE__ << std::endl;" : "" );
        if ( beg && next.size() >= 2 )
            es << "if ( ! buf ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        // es << "while ( buf->next ) {" << ( need_buf_next() > 1 ? " HPIPE_BUFF_T__INC_REF_N( buf, " + to_string( need_buf_next() - 1 ) + " );" : "" ) << " buf = buf->next; if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << "; } }";
        if ( cpp_emitter->buffer_type == CppEmitter::BT_HPIPE_CB_STRING_PTR )
            es << "while ( buf->next ) { end -= buf->used; buf = buf->next; if ( buf && buf->used ) { data = buf->data; end_m1 = buf->data + ( buf->used < end ? buf->used : end ) - 1; goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << "; } }";
        else if ( need_buf_next() )
            es << "while ( buf->next ) { HPIPE_BUFF_T__INC_REF_N( buf, " << need_buf_next() - 1 << " ); buf = buf->next; if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << "; } }";
        else
            es << "while ( buf->next ) { HPIPE_BUFF_T *old = buf; buf = buf->next; HPIPE_BUFF_T__DEC_REF( old ); if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << "; } }";

        if ( cpp_emitter->interruptible() ) {
            if ( next.size() >= 2 )
                es << "if ( last_buf ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";

            if ( need_buf_next() ) {
                cpp_emitter->add_variable( "pending_buf", "HPIPE_BUFF_T *" );
                es << "HPIPE_DATA.pending_buf = buf;";
                es << "HPIPE_DATA.inp_cont = &&e_" << cont_label << ";";
                if ( need_buf_next() == 1 )
                    es << "HPIPE_BUFF_T__INC_REF( buf );";
                else
                    es << "HPIPE_BUFF_T__INC_REF_N( buf, " << need_buf_next() << " );";
                es << "return RET_CONT;";

                // e_... (come back code)
                es.rm_beg( 2 ) << "e_" << cont_label << ":" << ( cpp_emitter->trace_labels ? " std::cout << \"e_" + to_string( cont_label ) + " \" << __LINE__ << std::endl;" : "" );
                es << "HPIPE_DATA.pending_buf->next = buf;";
                es << "HPIPE_DATA.pending_buf = buf;";
                es << "if ( data > end_m1 ) goto c_" << cont_label << ";";
                es << "goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << ";";
            } else {
                es << "HPIPE_DATA.inp_cont = &&e_" << cont_label << ";";
                es << "return RET_CONT;";

                // e_... (come back code)
                es.rm_beg( 2 ) << "e_" << cont_label << ":";
                es << "if ( data > end_m1 ) goto c_" << cont_label << ";";
                es << "goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << ";";
            }
        } else {
            if ( next.size() >= 2 )
                es << "goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        }
    } else if ( cpp_emitter->buffer_type == CppEmitter::BT_C_STR ) {
        if ( next.size() >= 2 )
            ss << "if ( *" << ( beg ? "data" : "( data + 1 )" ) << " == " << cpp_emitter->stop_char << " ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        if ( ! beg )
            ss << "++data;";
    } else { // not interruptible
        if ( next.size() >= 2 )
            ss << "if ( data " << ( beg ? ">" : ">=" ) << " end_m1 ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        if ( ! beg )
            ss << "++data;";
    }

    write_trans( ss, cpp_emitter );
}